

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::factorize(SPxBasisBase<double> *this)

{
  int iVar1;
  SPxStatusException *this_00;
  SPxInternalCodeException *this_01;
  double extraout_XMM0_Qa;
  double dVar2;
  allocator local_39;
  string local_38;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  this->updateCount = 0;
  iVar1 = (*this->factor->_vptr_SLinSolver[5])
                    (this->factor,(this->matrix).data,(ulong)(uint)(this->matrix).thesize);
  if (iVar1 == 2) {
    if (this->thestatus != SINGULAR) {
      this->thestatus = SINGULAR;
    }
    this->factorized = false;
  }
  else {
    if (iVar1 != 0) {
      std::operator<<((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n");
      this->factorized = false;
      this_01 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_38,"XBASIS01 This should never happen.",&local_39);
      SPxInternalCodeException::SPxInternalCodeException(this_01,&local_38);
      __cxa_throw(this_01,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if (this->thestatus == SINGULAR) {
      this->thestatus = REGULAR;
    }
    this->factorized = true;
    (*this->factor->_vptr_SLinSolver[6])();
    dVar2 = (double)(~-(ulong)(0.0001 < extraout_XMM0_Qa) & (ulong)extraout_XMM0_Qa |
                    (ulong)(extraout_XMM0_Qa * 0.001) & -(ulong)(0.0001 < extraout_XMM0_Qa));
    dVar2 = (double)(~-(ulong)(1e-05 < dVar2) & (ulong)dVar2 |
                    (ulong)(dVar2 * 0.01) & -(ulong)(1e-05 < dVar2));
    this->minStab = dVar2;
    if (1e-06 < dVar2) {
      this->minStab = dVar2 * 0.1;
    }
  }
  iVar1 = (*this->factor->_vptr_SLinSolver[3])();
  this->lastMem = iVar1;
  if (this->nzCount < 1) {
    dVar2 = 1.0;
  }
  else {
    dVar2 = (double)this->nzCount;
  }
  this->lastFill = ((double)iVar1 * this->fillFactor) / dVar2;
  this->lastNzCount = (int)(dVar2 * this->nonzeroFactor);
  if (this->thestatus != SINGULAR) {
    return;
  }
  this_00 = (SPxStatusException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"Cannot factorize singular matrix",&local_39);
  SPxStatusException::SPxStatusException(this_00,&local_38);
  __cxa_throw(this_00,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}